

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationOverWriteCase::
genShaderMainBlock_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char cVar1;
  string *psVar2;
  ostream *poVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  string localID;
  ostringstream s;
  ostringstream buf;
  long *local_490;
  long local_488;
  long local_480;
  long lStack_478;
  long *local_470;
  undefined8 local_468;
  long local_460;
  undefined8 uStack_458;
  long *local_450;
  undefined8 local_448;
  long local_440;
  undefined8 uStack_438;
  ulong local_430;
  ulong *local_428;
  long local_420;
  ulong local_418;
  long lStack_410;
  ulong *local_408;
  long local_400;
  ulong local_3f8;
  long lStack_3f0;
  ulong *local_3e8;
  long local_3e0;
  ulong local_3d8 [2];
  ulong *local_3c8;
  long local_3c0;
  ulong local_3b8 [2];
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  string *local_368;
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  string local_320 [3];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  local_368 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (0 < *(int *)((long)this + 0x90)) {
    iVar9 = 0;
    do {
      if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, ",0x3d);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar9);
          lVar8 = 10;
          pcVar11 = ")], 456);\n";
        }
        else {
          if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014eb256;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tsb_store.values[getIndex(gl_LocalInvocationID.xy, ",
                     0x33);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar9);
          lVar8 = 10;
          pcVar11 = ")] = 456;\n";
        }
LAB_014eb331:
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar11,lVar8);
      }
      else {
LAB_014eb256:
        if (*(int *)((long)this + 0x78) == 1) {
          if (*(char *)((long)this + 0x7c) == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, ",0x3b);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar9);
            lVar8 = 9;
            pcVar11 = "), 456);\n";
          }
          else {
            if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014eb339;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, ",0x37);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar9);
            lVar8 = 0x19;
            pcVar11 = "), ivec4(456, 0, 0, 0));\n";
          }
          goto LAB_014eb331;
        }
      }
LAB_014eb339:
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)((long)this + 0x90));
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(local_320,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,local_320[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)((long)this + 0x90)) {
    local_430 = 0;
    iVar9 = 0;
    do {
      cVar1 = *(char *)((long)this + 0x7e);
      if (cVar1 == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,iVar9 + 4);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0x1c98dc3);
        local_388 = &local_378;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_378 = *plVar6;
          lStack_370 = plVar4[3];
        }
        else {
          local_378 = *plVar6;
          local_388 = (long *)*plVar4;
        }
        local_380 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_388);
        local_408 = &local_3f8;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_3f8 = *puVar7;
          lStack_3f0 = plVar4[3];
        }
        else {
          local_3f8 = *puVar7;
          local_408 = (ulong *)*plVar4;
        }
        local_400 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,(int)local_430);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        uVar12 = 0xf;
        if (local_408 != &local_3f8) {
          uVar12 = local_3f8;
        }
        if (uVar12 < (ulong)(local_3c0 + local_400)) {
          uVar12 = 0xf;
          if (local_3c8 != local_3b8) {
            uVar12 = local_3b8[0];
          }
          if (uVar12 < (ulong)(local_3c0 + local_400)) goto LAB_014eb5c3;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_3c8,0,(char *)0x0,(ulong)local_408);
        }
        else {
LAB_014eb5c3:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_3c8);
        }
        local_450 = &local_440;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_440 = *plVar4;
          uStack_438 = puVar5[3];
        }
        else {
          local_440 = *plVar4;
          local_450 = (long *)*puVar5;
        }
        local_448 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_480 = *plVar6;
          lStack_478 = plVar4[3];
          local_490 = &local_480;
        }
        else {
          local_480 = *plVar6;
          local_490 = (long *)*plVar4;
        }
        local_488 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
      }
      else {
        local_490 = &local_480;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_490,"gl_LocalInvocationID.xy","");
      }
      if (cVar1 != '\0') {
        if (local_450 != &local_440) {
          operator_delete(local_450,local_440 + 1);
        }
        if (local_3c8 != local_3b8) {
          operator_delete(local_3c8,local_3b8[0] + 1);
        }
        if (cVar1 != '\0') {
          if (local_408 != &local_3f8) {
            operator_delete(local_408,local_3f8 + 1);
          }
          if (local_388 != &local_378) {
            operator_delete(local_388,local_378 + 1);
          }
          if (local_340[0] != local_330) {
            operator_delete(local_340[0],local_330[0] + 1);
          }
        }
      }
      if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tatomicExchange(sb_store.values[getIndex(",0x29);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_490,local_488);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
          lVar8 = 0xf;
          pcVar11 = ")], groupNdx);\n";
        }
        else {
          if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014eb756;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tsb_store.values[getIndex(",0x1a);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_490,local_488);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
          lVar8 = 0xf;
          pcVar11 = ")] = groupNdx;\n";
        }
LAB_014eb91c:
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar11,lVar8);
      }
      else {
LAB_014eb756:
        if (*(int *)((long)this + 0x78) == 1) {
          if (*(char *)((long)this + 0x7c) == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"\timageAtomicExchange(u_image, getCoord(",0x27);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_490,local_488);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
            lVar8 = 0xe;
            pcVar11 = "), groupNdx);\n";
          }
          else {
            if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014eb924;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"\timageStore(u_image, getCoord(",0x1e);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_490,local_488);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
            lVar8 = 0x1e;
            pcVar11 = "), ivec4(groupNdx, 0, 0, 0));\n";
          }
          goto LAB_014eb91c;
        }
      }
LAB_014eb924:
      if (local_490 != &local_480) {
        operator_delete(local_490,local_480 + 1);
      }
      iVar9 = iVar9 + 1;
      local_430 = (ulong)((int)local_430 + 3);
    } while (iVar9 < *(int *)((long)this + 0x90));
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(local_320,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,local_320[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)((long)this + 0x90)) {
    iVar9 = 0;
    iVar10 = 0;
    do {
      cVar1 = *(char *)((long)this + 0x7e);
      if (cVar1 == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,iVar10 + 1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_360,0,(char *)0x0,0x1c98dc3);
        local_3a8 = &local_398;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_398 = *plVar6;
          lStack_390 = plVar4[3];
        }
        else {
          local_398 = *plVar6;
          local_3a8 = (long *)*plVar4;
        }
        local_3a0 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        local_428 = &local_418;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_418 = *puVar7;
          lStack_410 = plVar4[3];
        }
        else {
          local_418 = *puVar7;
          local_428 = (ulong *)*plVar4;
        }
        local_420 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,iVar9);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        uVar12 = 0xf;
        if (local_428 != &local_418) {
          uVar12 = local_418;
        }
        if (uVar12 < (ulong)(local_3e0 + local_420)) {
          uVar12 = 0xf;
          if (local_3e8 != local_3d8) {
            uVar12 = local_3d8[0];
          }
          if (uVar12 < (ulong)(local_3e0 + local_420)) goto LAB_014ebbb2;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,(ulong)local_428);
        }
        else {
LAB_014ebbb2:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_3e8);
        }
        local_470 = &local_460;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_460 = *plVar4;
          uStack_458 = puVar5[3];
        }
        else {
          local_460 = *plVar4;
          local_470 = (long *)*puVar5;
        }
        local_468 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_470);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_480 = *plVar4;
          lStack_478 = puVar5[3];
          local_490 = &local_480;
        }
        else {
          local_480 = *plVar4;
          local_490 = (long *)*puVar5;
        }
        local_488 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
      }
      else {
        local_490 = &local_480;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_490,"gl_LocalInvocationID.xy","");
      }
      if (cVar1 != '\0') {
        if (local_470 != &local_460) {
          operator_delete(local_470,local_460 + 1);
        }
        if (local_3e8 != local_3d8) {
          operator_delete(local_3e8,local_3d8[0] + 1);
        }
        if (cVar1 != '\0') {
          if (local_428 != &local_418) {
            operator_delete(local_428,local_418 + 1);
          }
          if (local_3a8 != &local_398) {
            operator_delete(local_3a8,local_398 + 1);
          }
          if (local_360[0] != local_350) {
            operator_delete(local_360[0],local_350[0] + 1);
          }
        }
      }
      if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(",0x3b);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_490,local_488);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar10);
          lVar8 = 0x17;
          pcVar11 = ")], 123) == groupNdx);\n";
        }
        else {
          if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014ebd3f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tallOk = allOk && (sb_store.values[getIndex(",0x2c);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_490,local_488);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar10);
          lVar8 = 0x11;
          pcVar11 = ")] == groupNdx);\n";
        }
LAB_014ebf05:
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar11,lVar8);
      }
      else {
LAB_014ebd3f:
        if (*(int *)((long)this + 0x78) == 1) {
          if (*(char *)((long)this + 0x7c) == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(",0x39);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_490,local_488);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar10);
            lVar8 = 0x16;
            pcVar11 = "), 123) == groupNdx);\n";
          }
          else {
            if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014ebf0d;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"\tallOk = allOk && (imageLoad(u_image, getCoord(",0x2f)
            ;
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_490,local_488);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar10);
            lVar8 = 0x13;
            pcVar11 = ")).x == groupNdx);\n";
          }
          goto LAB_014ebf05;
        }
      }
LAB_014ebf0d:
      if (local_490 != &local_480) {
        operator_delete(local_490,local_480 + 1);
      }
      iVar10 = iVar10 + 1;
      iVar9 = iVar9 + 2;
    } while (iVar10 < *(int *)((long)this + 0x90));
  }
  psVar2 = local_368;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string InvocationOverWriteCase::genShaderMainBlock (void) const
{
	std::ostringstream buf;

	// write

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")], 456);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")] = 456;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), 456);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), ivec4(456, 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// write over

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		// write another invocation's value or our own value depending on test type
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+4) + ", " + de::toString(3*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(" << localID << ", " << ndx << ")] = groupNdx;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(" << localID << ", " << ndx << "), ivec4(groupNdx, 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// read

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		// check another invocation's value or our own value depending on test type
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+1) + ", " + de::toString(2*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], 123) == groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tallOk = allOk && (sb_store.values[getIndex(" << localID << ", " << ndx << ")] == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), 123) == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\tallOk = allOk && (imageLoad(u_image, getCoord(" << localID << ", " << ndx << ")).x == groupNdx);\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	return buf.str();
}